

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Costs.cpp
# Opt level: O1

void __thiscall Costs::fillCoeffsAG(Costs *this,double **coeffs,double *sumY,uint n)

{
  ulong uVar1;
  ulong uVar2;
  double dVar3;
  uint uVar4;
  double *gtT;
  ulong uVar5;
  ulong uVar6;
  int iVar7;
  long lVar8;
  Costs *this_00;
  double *pdVar9;
  double *pdVar10;
  double dVar11;
  
  this_00 = (Costs *)((ulong)(n + 1) << 3);
  gtT = (double *)operator_new__((ulong)this_00);
  uVar4 = n - 1;
  if (1 < uVar4) {
    pdVar10 = sumY + 2;
    iVar7 = n - 2;
    pdVar9 = gtT + 3;
    lVar8 = 0;
    uVar6 = 1;
    do {
      uVar1 = uVar6 + 1;
      gtT[uVar6 + 1] = 0.0;
      if (uVar1 < n) {
        dVar3 = sumY[uVar6];
        dVar11 = gtT[lVar8 + 2];
        uVar5 = 0;
        do {
          uVar2 = uVar5 + 1;
          dVar11 = ((pdVar10[uVar5] - dVar3) + (double)(uVar2 & 0xffffffff) * dVar11) /
                   (double)((int)uVar5 + 2);
          pdVar9[uVar5] = dVar11;
          uVar5 = uVar2;
        } while (iVar7 != (int)uVar2);
      }
      linReg(this_00,coeffs[uVar6],gtT,(uint)uVar6,n);
      lVar8 = lVar8 + 1;
      pdVar10 = pdVar10 + 1;
      iVar7 = iVar7 + -1;
      pdVar9 = pdVar9 + 1;
      uVar6 = uVar1;
    } while (uVar1 != uVar4);
  }
  pdVar10 = coeffs[uVar4];
  pdVar10[2] = 0.0;
  pdVar10[3] = 0.0;
  *pdVar10 = 0.0;
  pdVar10[1] = 0.0;
  pdVar10 = coeffs[n];
  pdVar10[2] = 0.0;
  pdVar10[3] = 0.0;
  *pdVar10 = 0.0;
  pdVar10[1] = 0.0;
  operator_delete__(gtT);
  return;
}

Assistant:

void Costs::fillCoeffsAG(double** coeffs, double* sumY, unsigned int n)
{
  ///fill coeffs[t] = CoeffsAG[t] for t = 1 to n-1 (0 and n un-necessary)
  double* gtT = new double[n + 1];
  for(unsigned int t = 1; t < (n - 1); t++) /// Fill coeffs[t] using gtT[t + 1]... gtT[n]
  {
    gtT[t + 1] = 0;
    for(unsigned int T = t + 1; T < n; T++) //update gtT from gtT[t + 2] to gtT[n-1]
    {
      gtT[T + 1] = ((T-t)*gtT[T] + (sumY[T]-sumY[t]))/(T-t+1);
    }
    linReg(coeffs[t], gtT, t, n); //consider gtT only from t + 1 to n in this function
    //std::cout << t << " : " << coeffs[t][0] << " "<< coeffs[t][1] << " "<< coeffs[t][2] << " "<< coeffs[t][3] << std::endl;
  }
  coeffs[n - 1][0] = 0;
  coeffs[n - 1][1] = 0;
  coeffs[n - 1][2] = 0;
  coeffs[n - 1][3] = 0;

  coeffs[n][0] = 0;
  coeffs[n][1] = 0;
  coeffs[n][2] = 0;
  coeffs[n][3] = 0;

  delete [] gtT;
  gtT = NULL;
}